

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffinttyp(char *cval,int *dtype,int *negative,int *status)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  ulong uVar7;
  uint uVar8;
  
  if (0 < *status) {
    return *status;
  }
  *dtype = 0;
  *negative = 0;
  cVar3 = *cval;
  bVar2 = true;
  if (cVar3 == '+') {
LAB_001865e4:
    cVar3 = cval[1];
    cval = cval + 1;
  }
  else if (cVar3 == '-') {
    *negative = 1;
    bVar2 = false;
    goto LAB_001865e4;
  }
  if (cVar3 == '0') {
    cVar3 = '0';
    while (cVar3 == '0') {
      pcVar1 = cval + 1;
      cval = cval + 1;
      cVar3 = *pcVar1;
    }
    if (cVar3 != '\0') goto LAB_00186605;
  }
  else {
LAB_00186605:
    sVar5 = strlen(cval);
    uVar8 = (uint)sVar5;
    if (0 < (int)uVar8) {
      ppuVar6 = __ctype_b_loc();
      uVar7 = 0;
      do {
        if ((*(byte *)((long)*ppuVar6 + (long)cval[uVar7] * 2 + 1) & 8) == 0) {
          *status = 0x193;
          return 0x193;
        }
        uVar7 = uVar7 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar7);
    }
    if (uVar8 == 0) {
      *status = 0xcc;
      goto LAB_001866a6;
    }
    if (2 < (int)uVar8) {
      if (uVar8 == 4) goto LAB_0018666b;
      if (uVar8 - 6 < 4) goto LAB_0018667e;
      if (uVar8 - 0xb < 8) goto LAB_00186691;
      if (0x14 < uVar8) {
LAB_001866a0:
        *status = 0x193;
        goto LAB_001866a6;
      }
      if (bVar2) {
        if (9 < (int)uVar8) {
          if (uVar8 == 10) {
            iVar4 = strcmp(cval,"2147483647");
            if (iVar4 < 1) {
LAB_0018667e:
              *dtype = 0x1f;
              goto LAB_001866a6;
            }
            iVar4 = strcmp(cval,"4294967295");
            if (iVar4 < 1) {
              *dtype = 0x1e;
              goto LAB_001866a6;
            }
LAB_00186691:
            *dtype = 0x51;
          }
          else {
            if (uVar8 == 0x13) {
              iVar4 = strcmp(cval,"9223372036854775807");
              if (iVar4 < 1) goto LAB_00186691;
            }
            else {
              if (uVar8 != 0x14) goto LAB_001866a6;
              iVar4 = strcmp(cval,"18446744073709551615");
              if (0 < iVar4) goto LAB_001866a0;
            }
            *dtype = 0x50;
          }
          goto LAB_001866a6;
        }
        if (uVar8 == 3) {
          iVar4 = strcmp(cval,"127");
          if (iVar4 < 1) goto LAB_00186647;
          iVar4 = strcmp(cval,"255");
          if (iVar4 < 1) {
            *dtype = 0xb;
            goto LAB_001866a6;
          }
        }
        else {
          if (uVar8 != 5) goto LAB_001866a6;
          iVar4 = strcmp(cval,"32767");
          if (0 < iVar4) {
            iVar4 = strcmp(cval,"65535");
            if (iVar4 < 1) {
              *dtype = 0x14;
              goto LAB_001866a6;
            }
            goto LAB_0018667e;
          }
        }
      }
      else {
        if (9 < (int)uVar8) {
          if (uVar8 == 10) {
            iVar4 = strcmp(cval,"2147483648");
            if (iVar4 < 1) goto LAB_0018667e;
          }
          else {
            if (uVar8 != 0x13) goto LAB_001866a6;
            iVar4 = strcmp(cval,"9223372036854775808");
            if (0 < iVar4) goto LAB_001866a0;
          }
          goto LAB_00186691;
        }
        if (uVar8 == 3) {
          iVar4 = strcmp(cval,"128");
          if (iVar4 < 1) goto LAB_00186647;
        }
        else {
          if (uVar8 != 5) goto LAB_001866a6;
          iVar4 = strcmp(cval,"32768");
          if (0 < iVar4) goto LAB_0018667e;
        }
      }
LAB_0018666b:
      *dtype = 0x15;
      goto LAB_001866a6;
    }
  }
LAB_00186647:
  *dtype = 0xc;
LAB_001866a6:
  return *status;
}

Assistant:

int ffinttyp(char *cval,  /* I - formatted string representation of the integer */
           int *dtype, /* O - datatype code: TBYTE, TSHORT, TUSHORT, etc */
           int *negative, /* O - is cval negative? */
           int *status)  /* IO - error status */
/*
  determine implicit datatype of input integer string.
  This assumes that the string conforms to the FITS standard
  for integer keyword value, so may not detect all invalid formats.
*/
{
    int ii, len;
    char *p;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *dtype = 0;  /* initialize to NULL */
    *negative = 0;
    p = cval;

    if (*p == '+') {
        p++;   /* ignore leading + sign */
    } else if (*p == '-') {
        p++;
	*negative = 1;   /* this is a negative number */
    }

    if (*p == '0') {
        while (*p == '0') p++;  /* skip leading zeros */

        if (*p == 0) {  /* the value is a string of 1 or more zeros */
           *dtype  = TSBYTE;
	   return(*status);
        }
    }

    len = strlen(p);
    for (ii = 0; ii < len; ii++)  {
        if (!isdigit(*(p+ii))) {
	    *status = BAD_INTKEY;
	    return(*status);
	}
    }

    /* check for unambiguous cases, based on length of the string */
    if (len == 0) {
        *status = VALUE_UNDEFINED;
    } else if (len < 3) {
        *dtype = TSBYTE;
    } else if (len == 4) {
	*dtype = TSHORT;
    } else if (len > 5 && len < 10) {
        *dtype = TINT;
    } else if (len > 10 && len < 19) {
        *dtype = TLONGLONG;
    } else if (len > 20) {
	*status = BAD_INTKEY;
    } else {
    
      if (!(*negative)) {  /* positive integers */
	if (len == 3) {
	    if (strcmp(p,"127") <= 0 ) {
	        *dtype = TSBYTE;
	    } else if (strcmp(p,"255") <= 0 ) {
	        *dtype = TBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32767") <= 0 ) {
	        *dtype = TSHORT;
 	    } else if (strcmp(p,"65535") <= 0 ) {
	        *dtype = TUSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483647") <= 0 ) {
	        *dtype = TINT;
	    } else if (strcmp(p,"4294967295") <= 0 ) {
	        *dtype = TUINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775807") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*dtype = TULONGLONG;
	    }
	} else if (len == 20) {
	    if (strcmp(p,"18446744073709551615") <= 0 ) {
	        *dtype = TULONGLONG;
	    } else {
	        *status = BAD_INTKEY;
	    }
	}

      } else {  /* negative integers */
	if (len == 3) {
	    if (strcmp(p,"128") <= 0 ) {
	        *dtype = TSBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32768") <= 0 ) {
	        *dtype = TSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483648") <= 0 ) {
	        *dtype = TINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775808") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*status = BAD_INTKEY;
	    }
	}
      }
    }

    return(*status);
}